

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web.cpp
# Opt level: O0

void __thiscall
Web_Constraint::Changed
          (Web_Constraint *this,Am_Slot *slot_changed,Am_Constraint *changing_constraint)

{
  bool local_39;
  undefined1 local_38 [7];
  bool temp_changed;
  Am_Value temp_value;
  Input_Port *port;
  Am_Constraint *changing_constraint_local;
  Am_Slot *slot_changed_local;
  Web_Constraint *this_local;
  
  if (((Web_Constraint *)changing_constraint != this) &&
     (temp_value.value.wrapper_value =
           (Am_Wrapper *)Input_Port::Search(this->owner->in_list,slot_changed),
     (Input_Port *)temp_value.value.wrapper_value != (Input_Port *)0x0)) {
    if (((byte)temp_value.value.proc_value[0x31] & 1) != 0) {
      Am_Value::Am_Value((Am_Value *)local_38);
      Am_Web_Data::Validate(this->owner,slot_changed,(Am_Value *)local_38,&local_39);
      Am_Value::~Am_Value((Am_Value *)local_38);
    }
    Am_Web_Data::Enqueue(this->owner,(Input_Port *)temp_value.value.wrapper_value);
    Am_Web_Data::Invalidate(this->owner,slot_changed);
  }
  return;
}

Assistant:

void
Web_Constraint::Changed(const Am_Slot &slot_changed,
                        Am_Constraint *changing_constraint)
{
  if (changing_constraint == this)
    return;
  Input_Port *port = owner->in_list->Search(slot_changed);
  if (!port)
    return;
  if (port->changed) {
    Am_Value temp_value;
    bool temp_changed;
    owner->Validate(slot_changed, temp_value, temp_changed);
  }
  owner->Enqueue(port);
  /*if (!slot_changed)*/
  owner->Invalidate(slot_changed);
}